

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error asmjit::X86Internal::argsToFrameInfo(FuncArgsMapper *args,FuncFrameInfo *ffi)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Error EVar4;
  long extraout_RDX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  X86FuncArgsContext ctx;
  undefined4 auStack_228 [66];
  undefined8 uStack_120;
  X86FuncArgsContext local_118;
  
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  local_118._workData[3] = (WorkData)vmovdqu64_avx512f(auVar7);
  local_118._workData[2] = (WorkData)vmovdqu64_avx512f(auVar7);
  local_118._workData[1] = (WorkData)vmovdqu64_avx512f(auVar7);
  local_118._workData[0] = (WorkData)vmovdqu64_avx512f(auVar7);
  local_118._hasStackArgs = false;
  local_118._hasRegSwaps = false;
  uStack_120 = 0x1715ea;
  EVar4 = X86FuncArgsContext::initWorkData
                    (&local_118,args,ffi->_dirtyRegs,(bool)((byte)ffi->_attributes & 1));
  if (EVar4 == 0) {
    vpmovzxbd_avx(ZEXT416(0xc0804000));
    puVar1 = &local_118._workData[0].usedRegs;
    auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)puVar1 * 2));
    vpmovzxbd_avx(ZEXT416(0xd0905010));
    auVar6 = vpgatherdd_avx512vl(*(undefined4 *)
                                  ((long)puVar1 + (long)(local_118._workData[0].reserved + -0x17)));
    auVar2 = vpor_avx(auVar6,auVar5);
    auVar6 = vpmovzxbd_avx(ZEXT416(0xc4844404));
    auVar5 = vpgatherdd_avx512vl(*(undefined4 *)
                                  (local_118._workData[0].reserved + extraout_RDX + -0x17));
    auVar3 = vpor_avx(auVar5,auVar2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = &local_118;
    vpscatterdd_avx512vl(auVar5 + auVar6,0xffff,auVar3);
    auVar5 = vpor_avx(auVar2,*(undefined1 (*) [16])ffi->_dirtyRegs);
    *(undefined1 (*) [16])ffi->_dirtyRegs = auVar5;
    uStack_120 = 0x171667;
    X86FuncArgsContext::markRegsForSwaps(&local_118,ffi);
    uStack_120 = 0x171672;
    EVar4 = X86FuncArgsContext::markStackArgsReg(&local_118,ffi);
  }
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::argsToFrameInfo(const FuncArgsMapper& args, FuncFrameInfo& ffi) noexcept {
  X86FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(args, ffi._dirtyRegs, ffi.hasPreservedFP()));

  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(ffi));
  ASMJIT_PROPAGATE(ctx.markRegsForSwaps(ffi));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(ffi));
  return kErrorOk;
}